

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O1

void __thiscall Shader::fix_version(Shader *this,string *code)

{
  char *pcVar1;
  string ver_str;
  long *local_38;
  char *local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"#version 330","");
  std::__cxx11::string::append((char *)&local_38);
  if (*(code->_M_dataplus)._M_p == '#') {
    pcVar1 = (char *)std::__cxx11::string::find((char)code,10);
    if (pcVar1 == (char *)0xffffffffffffffff) {
      pcVar1 = local_30;
    }
    std::__cxx11::string::replace((ulong)code,0,pcVar1,(ulong)local_38);
  }
  else {
    std::__cxx11::string::push_back((char)&local_38);
    std::__cxx11::string::replace((ulong)code,0,(char *)0x0,(ulong)local_38);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

void Shader::fix_version(std::string& code)
{
    std::string ver_str = GLSL_VERSION_STR;
    ver_str += GLSL_PROFILE;

    // Version string is present -> need to set to current version
    if (code[0] == '#')
    {
        // Replace until end of the line
        size_t endl = code.find('\n');
        if (endl != std::string::npos)
            code.replace(0, endl, ver_str);
        else
            code.replace(0, ver_str.length(), ver_str);
    }
    else
    {
        // Prepend the version string
        ver_str += '\n';
        code.replace(0, 0, ver_str);
    }
}